

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaReadBlif.c
# Opt level: O0

void Prs_ManSaveCover(Prs_Man_t *p)

{
  Abc_Nam_t *p_00;
  Prs_Ntk_t *pPVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  char *pStr;
  int iToken;
  Prs_Man_t *p_local;
  
  iVar3 = Vec_StrSize(&p->vCover);
  if (iVar3 == 0) {
    p->pNtk->field_0x4 = p->pNtk->field_0x4 & 0xfb | 4;
  }
  else {
    iVar3 = Vec_StrSize(&p->vCover);
    if (iVar3 == 2) {
      cVar2 = Vec_StrEntryLast(&p->vCover);
      if (cVar2 == '0') {
        p->pNtk->field_0x4 = p->pNtk->field_0x4 & 0xfb | 4;
      }
      else {
        cVar2 = Vec_StrEntryLast(&p->vCover);
        if (cVar2 != '1') {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/cba/cbaReadBlif.c"
                        ,0xe9,"void Prs_ManSaveCover(Prs_Man_t *)");
        }
        p->pNtk->field_0x4 = p->pNtk->field_0x4 & 0xf7 | 8;
      }
    }
  }
  iVar3 = Vec_StrSize(&p->vCover);
  if (iVar3 < 1) {
    __assert_fail("Vec_StrSize(&p->vCover) > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/cba/cbaReadBlif.c"
                  ,0xeb,"void Prs_ManSaveCover(Prs_Man_t *)");
  }
  Vec_StrPush(&p->vCover,'\0');
  p_00 = p->pFuns;
  pStr = Vec_StrArray(&p->vCover);
  iVar3 = Abc_NamStrFindOrAdd(p_00,pStr,(int *)0x0);
  Vec_StrClear(&p->vCover);
  pPVar1 = p->pNtk;
  iVar4 = Prs_NtkBoxNum(p->pNtk);
  iVar4 = Prs_BoxNtk(pPVar1,iVar4 + -1);
  if (iVar4 != 1) {
    __assert_fail("Prs_BoxNtk(p->pNtk, Prs_NtkBoxNum(p->pNtk)-1) == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/cba/cbaReadBlif.c"
                  ,0xf1,"void Prs_ManSaveCover(Prs_Man_t *)");
  }
  pPVar1 = p->pNtk;
  iVar4 = Prs_NtkBoxNum(p->pNtk);
  Prs_BoxSetNtk(pPVar1,iVar4 + -1,iVar3);
  return;
}

Assistant:

static inline void Prs_ManSaveCover( Prs_Man_t * p )
{
    int iToken;
    if ( Vec_StrSize(&p->vCover) == 0 )
        p->pNtk->fHasC0s = 1;
    else if ( Vec_StrSize(&p->vCover) == 2 )
    {
        if ( Vec_StrEntryLast(&p->vCover) == '0' )
            p->pNtk->fHasC0s = 1;
        else if ( Vec_StrEntryLast(&p->vCover) == '1' )
            p->pNtk->fHasC1s = 1;
        else assert( 0 );
    }
    assert( Vec_StrSize(&p->vCover) > 0 );
    Vec_StrPush( &p->vCover, '\0' );
//    iToken = Ptr_SopToType( Vec_StrArray(&p->vCover) );
    iToken = Abc_NamStrFindOrAdd( p->pFuns, Vec_StrArray(&p->vCover), NULL );
    Vec_StrClear( &p->vCover );
    // set the cover to the module of this box
    assert( Prs_BoxNtk(p->pNtk, Prs_NtkBoxNum(p->pNtk)-1) == 1 ); // default const 0
    Prs_BoxSetNtk( p->pNtk, Prs_NtkBoxNum(p->pNtk)-1, iToken );
}